

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeleteMessage.cpp
# Opt level: O2

void __thiscall DeleteMessage::DeleteMessage(DeleteMessage *this,char *directory)

{
  ServerOperation::ServerOperation(&this->super_ServerOperation,directory);
  (this->super_ServerOperation)._vptr_ServerOperation = (_func_int **)&PTR_fillMe_00108ce0;
  (this->username)._M_dataplus._M_p = (pointer)&(this->username).field_2;
  (this->username)._M_string_length = 0;
  (this->username).field_2._M_local_buf[0] = '\0';
  this->parameter_count = 0;
  this->chosen_message = 0;
  std::__cxx11::string::assign((char *)&this->username);
  std::__cxx11::string::assign((char *)&(this->super_ServerOperation).statusMessage);
  return;
}

Assistant:

DeleteMessage::DeleteMessage(const char * directory) : ServerOperation(directory) {
    parameter_count = 0;
    chosen_message = 0;
    username = "";
    statusMessage = "User:";
}